

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::type_caster_generic::load
          (type_caster_generic *this,handle src,bool convert,PyTypeObject *tobj)

{
  _func__object_ptr__object_ptr__typeobject_ptr *p_Var1;
  vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_> *this_00;
  _func_bool__object_ptr_void_ptr_ptr *p_Var2;
  byte bVar3;
  type_caster_generic *src_00;
  bool bVar4;
  bool bVar5;
  int iVar6;
  PyObject **ppPVar7;
  internals *piVar8;
  vector<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
  *this_01;
  void *pvVar9;
  vector<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
  *this_02;
  _object *ptr;
  reference pp_Var10;
  _func_bool__object_ptr_void_ptr_ptr **converter_1;
  iterator __end3_2;
  iterator __begin3_2;
  vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_> *__range3_2;
  handle local_140;
  object local_138;
  reference local_130;
  _func__object_ptr__object_ptr__typeobject_ptr **converter;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
  *__range3_1;
  undefined1 local_108 [8];
  type_caster_generic sub_caster;
  pair<const_std::type_info_*,_void_*(*)(void_*)> *cast;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
  *__range3;
  handle hStack_c0;
  bool result;
  handle parent;
  undefined1 local_b0 [8];
  iterator __end4;
  undefined1 local_88 [8];
  iterator __begin4;
  tuple *__range4;
  tuple local_60;
  tuple parents;
  unordered_map<const_void_*,_void_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>_>
  *local_50;
  _Node_iterator_base<std::pair<const_void_*const,_void_*>,_false> local_48;
  byte local_39;
  unordered_map<const_void_*,_void_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>_>
  *puStack_38;
  bool new_style_class;
  unordered_map<const_void_*,_void_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>_>
  *type_dict;
  PyTypeObject *tobj_local;
  type_caster_generic *ptStack_20;
  bool convert_local;
  type_caster_generic *this_local;
  handle src_local;
  
  type_dict = (unordered_map<const_void_*,_void_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>_>
               *)tobj;
  tobj_local._7_1_ = convert;
  ptStack_20 = this;
  this_local = (type_caster_generic *)src.m_ptr;
  bVar4 = handle::operator_cast_to_bool((handle *)&this_local);
  if ((bVar4) && (this->typeinfo != (type_info *)0x0)) {
    bVar4 = object_api<pybind11::handle>::is_none((object_api<pybind11::handle> *)&this_local);
    if (bVar4) {
      this->value = (void *)0x0;
      src_local.m_ptr._7_1_ = 1;
    }
    else {
      if ((this->typeinfo->simple_type & 1U) == 0) {
        if ((PyTypeObject *)type_dict == this->typeinfo->type) {
          ppPVar7 = handle::ptr((handle *)&this_local);
          this->value = (void *)(*ppPVar7)[1].ob_refcnt;
          src_local.m_ptr._7_1_ = 1;
          goto LAB_0017a017;
        }
        piVar8 = get_internals();
        puStack_38 = &piVar8->registered_types_py;
        iVar6 = _PyType_Check((PyObject *)type_dict);
        local_39 = iVar6 != 0;
        local_50 = type_dict;
        local_48._M_cur =
             (__node_type *)
             std::
             unordered_map<const_void_*,_void_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>_>
             ::find(puStack_38,&local_50);
        parents.super_object.super_handle.m_ptr =
             (object)std::
                     unordered_map<const_void_*,_void_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>_>
                     ::end(puStack_38);
        bVar5 = std::__detail::operator==
                          (&local_48,
                           (_Node_iterator_base<std::pair<const_void_*const,_void_*>,_false> *)
                           &parents);
        bVar4 = false;
        if ((bVar5) && (bVar4 = false, (local_39 & 1) != 0)) {
          bVar4 = type_dict[6]._M_h._M_buckets != (__buckets_ptr)0x0;
        }
        if (bVar4) {
          handle::handle((handle *)&__range4,(PyObject *)type_dict[6]._M_h._M_buckets);
          reinterpret_borrow<pybind11::tuple>((pybind11 *)&local_60,(handle)__range4);
          __begin4._16_8_ = (pybind11 *)&local_60;
          object_api<pybind11::handle>::begin
                    ((iterator *)local_88,(object_api<pybind11::handle> *)&local_60);
          object_api<pybind11::handle>::end
                    ((iterator *)local_b0,(object_api<pybind11::handle> *)__begin4._16_8_);
          while (bVar4 = iterator::operator!=((iterator *)local_88,(iterator *)local_b0), bVar4) {
            hStack_c0 = iterator::operator*((iterator *)local_88);
            src_00 = this_local;
            bVar3 = tobj_local._7_1_;
            ppPVar7 = handle::ptr(&stack0xffffffffffffff40);
            bVar4 = load(this,(handle)src_00,(bool)(bVar3 & 1),(PyTypeObject *)*ppPVar7);
            if (bVar4) {
              src_local.m_ptr._7_1_ = 1;
              parent.m_ptr._4_4_ = 1;
              goto LAB_00179c6a;
            }
            iterator::operator++((iterator *)local_88);
          }
          parent.m_ptr._4_4_ = 2;
LAB_00179c6a:
          iterator::~iterator((iterator *)local_b0);
          iterator::~iterator((iterator *)local_88);
          if (parent.m_ptr._4_4_ == 2) {
            parent.m_ptr._4_4_ = 0;
          }
          tuple::~tuple(&local_60);
          if (parent.m_ptr._4_4_ != 0) goto LAB_0017a017;
        }
        this_01 = &this->typeinfo->implicit_casts;
        __end3 = std::
                 vector<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
                 ::begin(this_01);
        cast = (pair<const_std::type_info_*,_void_*(*)(void_*)> *)
               std::
               vector<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
               ::end(this_01);
        while (bVar4 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<const_std::pair<const_std::type_info_*,_void_*(*)(void_*)>_*,_std::vector<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>_>
                                           *)&cast), bVar4) {
          sub_caster.temp.super_handle.m_ptr =
               (handle)__gnu_cxx::
                       __normal_iterator<const_std::pair<const_std::type_info_*,_void_*(*)(void_*)>_*,_std::vector<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>_>
                       ::operator*(&__end3);
          type_caster_generic((type_caster_generic *)local_108,
                              (type_info *)
                              ((PyObject *)sub_caster.temp.super_handle.m_ptr)->ob_refcnt);
          bVar4 = load((type_caster_generic *)local_108,(handle)this_local,
                       (bool)(tobj_local._7_1_ & 1));
          if (bVar4) {
            pvVar9 = (void *)(**(code **)((long)sub_caster.temp.super_handle.m_ptr + 8))
                                       (sub_caster.typeinfo);
            this->value = pvVar9;
            src_local.m_ptr._7_1_ = 1;
          }
          parent.m_ptr._5_3_ = 0;
          parent.m_ptr._4_1_ = bVar4;
          ~type_caster_generic((type_caster_generic *)local_108);
          if (parent.m_ptr._4_4_ != 0) goto LAB_0017a017;
          __gnu_cxx::
          __normal_iterator<const_std::pair<const_std::type_info_*,_void_*(*)(void_*)>_*,_std::vector<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>_>
          ::operator++(&__end3);
        }
      }
      else {
        iVar6 = PyType_IsSubtype(type_dict,this->typeinfo->type);
        if (iVar6 != 0) {
          ppPVar7 = handle::ptr((handle *)&this_local);
          this->value = (void *)(*ppPVar7)[1].ob_refcnt;
          src_local.m_ptr._7_1_ = 1;
          goto LAB_0017a017;
        }
      }
      if ((tobj_local._7_1_ & 1) != 0) {
        this_02 = &this->typeinfo->implicit_conversions;
        __end3_1 = std::
                   vector<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
                   ::begin(this_02);
        converter = (_func__object_ptr__object_ptr__typeobject_ptr **)
                    std::
                    vector<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
                    ::end(this_02);
        while (bVar4 = __gnu_cxx::operator!=
                                 (&__end3_1,
                                  (__normal_iterator<_object_*(*const_*)(_object_*,__typeobject_*),_std::vector<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>_>
                                   *)&converter), bVar4) {
          local_130 = __gnu_cxx::
                      __normal_iterator<_object_*(*const_*)(_object_*,__typeobject_*),_std::vector<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>_>
                      ::operator*(&__end3_1);
          p_Var1 = *local_130;
          ppPVar7 = handle::ptr((handle *)&this_local);
          ptr = (*p_Var1)(*ppPVar7,this->typeinfo->type);
          handle::handle(&local_140,ptr);
          reinterpret_steal<pybind11::object>((pybind11 *)&local_138,local_140);
          object::operator=(&this->temp,&local_138);
          object::~object(&local_138);
          bVar4 = load(this,(this->temp).super_handle.m_ptr,false);
          if (bVar4) {
            src_local.m_ptr._7_1_ = 1;
            goto LAB_0017a017;
          }
          __gnu_cxx::
          __normal_iterator<_object_*(*const_*)(_object_*,__typeobject_*),_std::vector<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>_>
          ::operator++(&__end3_1);
        }
        this_00 = this->typeinfo->direct_conversions;
        __end3_2 = std::
                   vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>
                   ::begin(this_00);
        converter_1 = (_func_bool__object_ptr_void_ptr_ptr **)
                      std::
                      vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>
                      ::end(this_00);
        while (bVar4 = __gnu_cxx::operator!=
                                 (&__end3_2,
                                  (__normal_iterator<bool_(**)(_object_*,_void_*&),_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>
                                   *)&converter_1), bVar4) {
          pp_Var10 = __gnu_cxx::
                     __normal_iterator<bool_(**)(_object_*,_void_*&),_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>
                     ::operator*(&__end3_2);
          p_Var2 = *pp_Var10;
          ppPVar7 = handle::ptr((handle *)&this_local);
          bVar4 = (*p_Var2)(*ppPVar7,&this->value);
          if (bVar4) {
            src_local.m_ptr._7_1_ = 1;
            goto LAB_0017a017;
          }
          __gnu_cxx::
          __normal_iterator<bool_(**)(_object_*,_void_*&),_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>
          ::operator++(&__end3_2);
        }
      }
      src_local.m_ptr._7_1_ = 0;
    }
  }
  else {
    src_local.m_ptr._7_1_ = 0;
  }
LAB_0017a017:
  return (bool)(src_local.m_ptr._7_1_ & 1);
}

Assistant:

bool load(handle src, bool convert, PyTypeObject *tobj) {
        if (!src || !typeinfo)
            return false;
        if (src.is_none()) {
            value = nullptr;
            return true;
        }

        if (typeinfo->simple_type) { /* Case 1: no multiple inheritance etc. involved */
            /* Check if we can safely perform a reinterpret-style cast */
            if (PyType_IsSubtype(tobj, typeinfo->type)) {
                value = reinterpret_cast<instance<void> *>(src.ptr())->value;
                return true;
            }
        } else { /* Case 2: multiple inheritance */
            /* Check if we can safely perform a reinterpret-style cast */
            if (tobj == typeinfo->type) {
                value = reinterpret_cast<instance<void> *>(src.ptr())->value;
                return true;
            }

            /* If this is a python class, also check the parents recursively */
            auto const &type_dict = get_internals().registered_types_py;
            bool new_style_class = PyType_Check((PyObject *) tobj);
            if (type_dict.find(tobj) == type_dict.end() && new_style_class && tobj->tp_bases) {
                auto parents = reinterpret_borrow<tuple>(tobj->tp_bases);
                for (handle parent : parents) {
                    bool result = load(src, convert, (PyTypeObject *) parent.ptr());
                    if (result)
                        return true;
                }
            }

            /* Try implicit casts */
            for (auto &cast : typeinfo->implicit_casts) {
                type_caster_generic sub_caster(*cast.first);
                if (sub_caster.load(src, convert)) {
                    value = cast.second(sub_caster.value);
                    return true;
                }
            }
        }

        /* Perform an implicit conversion */
        if (convert) {
            for (auto &converter : typeinfo->implicit_conversions) {
                temp = reinterpret_steal<object>(converter(src.ptr(), typeinfo->type));
                if (load(temp, false))
                    return true;
            }
            for (auto &converter : *typeinfo->direct_conversions) {
                if (converter(src.ptr(), value))
                    return true;
            }
        }
        return false;
    }